

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges.cpp
# Opt level: O0

void __thiscall
sdf_tools::sdf::SdfEdges::SdfEdges
          (SdfEdges *this,vector<sdf_tools::real2,_std::allocator<sdf_tools::real2>_> *edges,
          bool inside,int nsamples)

{
  real2 rVar1;
  int in_ECX;
  byte in_DL;
  SdfEdges *in_RDI;
  undefined1 in_stack_ffffffffffffffa8 [16];
  
  Sdf::Sdf(&in_RDI->super_Sdf);
  (in_RDI->super_Sdf)._vptr_Sdf = (_func_int **)&PTR__SdfEdges_001e3f38;
  std::vector<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>::vector
            (in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
  in_RDI->insideSign_ = (in_DL & 1) - 1 | 1;
  in_RDI->nsamples_ = in_ECX;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
  rVar1 = findOrigin_(in_RDI);
  in_RDI->origin_ = rVar1;
  return;
}

Assistant:

SdfEdges::SdfEdges(std::vector<real2> edges, bool inside, int nsamples) :
    edges_(std::move(edges)),
    insideSign_(inside ? 1 : -1),
    nsamples_(nsamples)
{
    origin_ = findOrigin_();
}